

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O3

int __thiscall cmCPackSTGZGenerator::InitializeInternal(cmCPackSTGZGenerator *this)

{
  pointer pcVar1;
  cmCPackLog *this_00;
  long *msg;
  int iVar2;
  ostream *poVar3;
  size_t length;
  string inFile;
  ostringstream cmCPackLog_msg;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  pcVar1 = local_190 + 0x10;
  local_190._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
  cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,(string *)local_190,"0");
  if ((pointer)local_190._0_8_ != pcVar1) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  (*(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
    _vptr_cmCPackGenerator[0xc])(&local_1d0,this,"CPack.STGZ_Header.sh.in");
  if (local_1c8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Cannot find template file: ",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(char *)local_1d0,local_1c8);
    std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    this_00 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator
              .Logger;
    std::__cxx11::stringbuf::str();
    msg = local_1b0;
    length = strlen((char *)local_1b0);
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                    ,0x1b,(char *)msg,length);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    iVar2 = 0;
  }
  else {
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CPACK_STGZ_HEADER_FILE","")
    ;
    cmCPackGenerator::SetOptionIfNotSet
              ((cmCPackGenerator *)this,(string *)local_190,(char *)local_1d0);
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    local_190._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CPACK_AT_SIGN","");
    cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,(string *)local_190,"@");
    if ((pointer)local_190._0_8_ != pcVar1) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    iVar2 = cmCPackArchiveGenerator::InitializeInternal((cmCPackArchiveGenerator *)this);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  return iVar2;
}

Assistant:

int cmCPackSTGZGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "0");

  std::string inFile = this->FindTemplate("CPack.STGZ_Header.sh.in");
  if (inFile.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find template file: " << inFile << std::endl);
    return 0;
  }
  this->SetOptionIfNotSet("CPACK_STGZ_HEADER_FILE", inFile.c_str());
  this->SetOptionIfNotSet("CPACK_AT_SIGN", "@");

  return this->Superclass::InitializeInternal();
}